

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
beast::lexicalCastThrow<std::__cxx11::string,int>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,beast *this,int in)

{
  enable_if_t<std::is_arithmetic<int>::value,_bool> eVar1;
  undefined8 *puVar2;
  undefined1 local_19;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  eVar1 = detail::LexicalCast<std::__cxx11::string,int>::operator()
                    (&local_19,__return_storage_ptr__,(int)this);
  if (eVar1) {
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_002d84a8;
  __cxa_throw(puVar2,&BadLexicalCast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

Out lexicalCastThrow (In in)
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    throw BadLexicalCast ();
}